

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Model::Model(Model *this,uint64_t id,Element *element,Document *doc,string *name)

{
  string *doc_00;
  Element *pEVar1;
  Element *pEVar2;
  Token *pTVar3;
  Token *t;
  allocator local_121;
  string local_120;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_100;
  string local_f0;
  string local_d0;
  allocator local_a9;
  string local_a8;
  Element *local_88;
  Element *Culling;
  string local_78;
  Element *local_58;
  Element *Shading;
  Scope *sc;
  allocator local_31;
  string *local_30;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  Model *this_local;
  
  local_30 = name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Model_0037b820;
  std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>::vector
            (&this->materials);
  std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::vector
            (&this->geometry);
  std::
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>::
  vector(&this->attributes);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->shading,"Y",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)&this->culling);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  pEVar1 = (Element *)GetRequiredScope((Element *)doc_local);
  Shading = pEVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"Shading",(allocator *)((long)&Culling + 7));
  pEVar2 = Scope::operator[]((Scope *)pEVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Culling + 7));
  pEVar1 = Shading;
  local_58 = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"Culling",&local_a9);
  pEVar1 = Scope::operator[]((Scope *)pEVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_88 = pEVar1;
  if (local_58 != (Element *)0x0) {
    pTVar3 = GetRequiredToken(local_58,0);
    Token::StringContents_abi_cxx11_(&local_d0,pTVar3);
    std::__cxx11::string::operator=((string *)&this->shading,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (local_88 != (Element *)0x0) {
    pTVar3 = GetRequiredToken(local_88,0);
    ParseTokenAsString_abi_cxx11_(&local_f0,(FBX *)pTVar3,t);
    std::__cxx11::string::operator=((string *)&this->culling,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  doc_00 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Model.FbxNode",&local_121);
  Util::GetPropertyTable
            ((Util *)&local_100,(Document *)doc_00,&local_120,(Element *)doc_local,(Scope *)Shading,
             false);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,&local_100);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  ResolveLinks(this,(Element *)doc_local,(Document *)name_local);
  return;
}

Assistant:

Model::Model(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Object(id,element,name)
    , shading("Y")
{
    const Scope& sc = GetRequiredScope(element);
    const Element* const Shading = sc["Shading"];
    const Element* const Culling = sc["Culling"];

    if(Shading) {
        shading = GetRequiredToken(*Shading,0).StringContents();
    }

    if (Culling) {
        culling = ParseTokenAsString(GetRequiredToken(*Culling,0));
    }

    props = GetPropertyTable(doc,"Model.FbxNode",element,sc);
    ResolveLinks(element,doc);
}